

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O2

string * ReadAll(string *__return_storage_ptr__,string *filename)

{
  stringstream stream;
  undefined1 local_388 [376];
  ifstream file;
  streambuf local_200 [504];
  
  std::ifstream::ifstream(&file,(filename->_M_dataplus)._M_p,_S_in);
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  std::ostream::operator<<(local_388,local_200);
  std::ifstream::close();
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  std::ifstream::~ifstream(&file);
  return __return_storage_ptr__;
}

Assistant:

static std::string ReadAll(const std::string& filename)
{
  cmsys::ifstream file(filename.c_str());
  cmsys_ios::stringstream stream;
  stream << file.rdbuf();
  file.close();
  return stream.str();
}